

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_TextRange_resizeT(ImVector_TextRange *self,int new_size,TextRange v)

{
  ImGuiTextRange local_10;
  
  local_10.e = v.e;
  local_10.b = v.b;
  ImVector<ImGuiTextFilter::ImGuiTextRange>::resize(self,new_size,&local_10);
  return;
}

Assistant:

CIMGUI_API void ImVector_TextRange_resizeT(ImVector_TextRange* self,int new_size,const TextRange v)
{
    return self->resize(new_size,v);
}